

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

timestamp_t __thiscall AnalogConsumer::getData(AnalogConsumer *this,int16_t *dest)

{
  value_type vVar1;
  int iVar2;
  uchar *puVar3;
  size_type sVar4;
  undefined4 extraout_var;
  reference pvVar5;
  byte *pbVar6;
  reference pvVar7;
  uint *puVar8;
  long in_RSI;
  HFSubConsumer *in_RDI;
  timestamp_t tVar9;
  int bit;
  int byt;
  size_t i;
  int il_i;
  int offset;
  byte *src;
  ulong local_38;
  int local_30;
  int local_2c;
  uint local_10;
  int64_t local_8;
  
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x341e94);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &in_RDI[1].super_HighFreqSub.dt.origin._M_string_length);
  iVar2 = (*(in_RDI->super_HighFreqSub)._vptr_HighFreqSub[5])(in_RDI,puVar3,sVar4);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    local_10 = 0;
    local_8 = 0;
  }
  else {
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x341eea);
    local_2c = 0;
    local_30 = 0;
    local_38 = 0;
    while( true ) {
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)
                         &in_RDI[1].super_HighFreqSub.dt.dataFormat);
      if (sVar4 <= local_38) break;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[1].super_HighFreqSub.dt.dataFormat,local_38);
      iVar2 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[1].super_HighFreqSub.dt.dataFormat,local_38 + 1);
      if (*pvVar5 == -1) {
        *(undefined2 *)(in_RSI + (long)local_2c * 2) = *(undefined2 *)(puVar3 + (long)iVar2 + 4);
      }
      else {
        pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &in_RDI[1].super_HighFreqSub.dt,(long)local_30);
        if ((*pbVar6 & puVar3[(long)*(int *)&in_RDI[1].super_HighFreqSub._vptr_HighFreqSub + 4]) ==
            0) {
          pvVar7 = std::vector<short,_std::allocator<short>_>::operator[]
                             ((vector<short,_std::allocator<short>_> *)
                              &in_RDI[1].super_HighFreqSub.dt.name.field_2,(long)local_30);
          *(value_type *)(in_RSI + (long)local_2c * 2) = *pvVar7;
        }
        else {
          *(undefined2 *)(in_RSI + (long)local_2c * 2) = *(undefined2 *)(puVar3 + (long)iVar2 + 4);
          vVar1 = *(value_type *)(in_RSI + (long)local_2c * 2);
          pvVar7 = std::vector<short,_std::allocator<short>_>::operator[]
                             ((vector<short,_std::allocator<short>_> *)
                              &in_RDI[1].super_HighFreqSub.dt.name.field_2,(long)local_30);
          *pvVar7 = vVar1;
        }
        local_30 = local_30 + 1;
      }
      local_2c = local_2c + 1;
      local_38 = local_38 + 2;
    }
    puVar8 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x342081);
    local_10 = *puVar8;
    local_8 = HFSubConsumer::lastSysTimestamp(in_RDI);
  }
  tVar9._4_4_ = 0;
  tVar9.trodes_timestamp = local_10;
  tVar9.system_timestamp = local_8;
  return tVar9;
}

Assistant:

timestamp_t AnalogConsumer::getData(int16_t *dest){
    if(!readData(temp_buffer.data(), temp_buffer.size())){
        return {0,0};
    }
    byte *src = (byte*)temp_buffer.data() + sizeof(uint32_t);
    int offset = 0;
    int il_i = 0;
    for(size_t i = 0; i < args.indices.size(); i += 2){
        int byt = args.indices[i];
        int bit = args.indices[i+1];
        if(bit == -1){
            //Non interleaved
            dest[offset] = *(int16_t*)(src+byt);
        }
        else{
            //Interleaved
            //Compare mask[il_i] and packet's il id byte
            if(il_id_masks[il_i] & src[il_byte_loc]){
                //If packet contains this type of data
                dest[offset] = *(int16_t*)(src+byt);
                prev_interleaved[il_i] = dest[offset];
            }
            else{
                //Else, use prev il data
                dest[offset] = prev_interleaved[il_i];
            }
            il_i++;
        }
        offset++;
    }
    return {*(uint32_t*)(temp_buffer.data()), lastSysTimestamp()}; //Timestamp at beginning of packet
}